

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_geometry
          (NodeLoader *this,instance_geometry__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  GeometryMaterialIdInfo *pGVar4;
  InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *this_00;
  InstanceGeometry *instanceGeometry;
  UniqueId instantiatedGeometryUniqueId;
  UniqueId uniqueId;
  InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *local_50;
  UniqueId local_48;
  UniqueId local_30;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,GEOMETRY,false);
  local_48.mClassId = pUVar3->mClassId;
  local_48._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_48.mObjectId = pUVar3->mObjectId;
  local_48.mFileId = pUVar3->mFileId;
  pGVar4 = IFilePartLoader::getMeshMaterialIdInfo
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader);
  this->mCurrentMaterialInfo = pGVar4;
  IFilePartLoader::createUniqueId
            (&local_30,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_GEOMETRY);
  this_00 = (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *)operator_new(0x98);
  COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>::InstanceBindingBase
            (this_00,&local_30,&local_48);
  this->mCurrentInstanceGeometry = this_00;
  local_50 = this_00;
  std::__cxx11::string::_M_assign
            ((string *)&(this_00->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mName);
  COLLADAFW::
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>::
  append(&(pNVar1->mInstanceGeometries).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>
         ,&local_50);
  COLLADAFW::UniqueId::~UniqueId(&local_30);
  COLLADAFW::UniqueId::~UniqueId(&local_48);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_geometry( const instance_geometry__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();

		COLLADAFW::UniqueId instantiatedGeometryUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Geometry::ID());
		mCurrentMaterialInfo = &getHandlingFilePartLoader()->getMeshMaterialIdInfo();

        COLLADAFW::UniqueId uniqueId = getHandlingFilePartLoader()->createUniqueId ( COLLADAFW::InstanceGeometry::ID() );
		COLLADAFW::InstanceGeometry* instanceGeometry = FW_NEW COLLADAFW::InstanceGeometry ( uniqueId, instantiatedGeometryUniqueId );
		mCurrentInstanceGeometry = instanceGeometry;
		instanceGeometry->setName(currentNode->getName());
		currentNode->getInstanceGeometries().append(instanceGeometry);

		return true;
	}